

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O0

void wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
     ::scan(SpillPointers *self,Expression **currp)

{
  bool bVar1;
  If *pIVar2;
  Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_> *pWVar3;
  Try *pTVar4;
  ulong uVar5;
  size_t sVar6;
  Expression **currp_00;
  BasicType local_4c;
  Module *local_48;
  Module *module_1;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *pAStack_38;
  Index i;
  ExpressionList *catchBodies;
  Module *module;
  Expression *ifFalse;
  Expression *curr;
  Expression **currp_local;
  SpillPointers *self_local;
  
  ifFalse = *currp;
  curr = (Expression *)currp;
  currp_local = (Expression **)self;
  switch(ifFalse->_id) {
  case BlockId:
    Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>::pushTask
              ((Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_> *)
               &(self->
                super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
                ).
                super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
               ,doEndBlock,currp);
    break;
  case IfId:
    Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>::pushTask
              ((Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_> *)
               &(self->
                super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
                ).
                super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
               ,doEndIf,currp);
    pIVar2 = Expression::cast<wasm::If>(ifFalse);
    module = (Module *)pIVar2->ifFalse;
    if (module != (Module *)0x0) {
      pWVar3 = (Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_> *)
               (currp_local + 0xb);
      pIVar2 = Expression::cast<wasm::If>(ifFalse);
      Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>::pushTask
                (pWVar3,scan,&pIVar2->ifFalse);
      Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>::pushTask
                ((Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_> *)
                 (currp_local + 0xb),doStartIfFalse,(Expression **)curr);
    }
    pWVar3 = (Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_> *)
             (currp_local + 0xb);
    pIVar2 = Expression::cast<wasm::If>(ifFalse);
    Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>::pushTask
              (pWVar3,scan,&pIVar2->ifTrue);
    Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>::pushTask
              ((Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_> *)
               (currp_local + 0xb),doStartIfTrue,(Expression **)curr);
    pWVar3 = (Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_> *)
             (currp_local + 0xb);
    pIVar2 = Expression::cast<wasm::If>(ifFalse);
    Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>::pushTask
              (pWVar3,scan,&pIVar2->condition);
    return;
  case LoopId:
    Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>::pushTask
              ((Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_> *)
               &(self->
                super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
                ).
                super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
               ,doEndLoop,currp);
    break;
  default:
    bVar1 = Properties::isBranch(ifFalse);
    if (bVar1) {
      Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>::pushTask
                ((Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_> *)
                 (currp_local + 0xb),doEndBranch,(Expression **)curr);
    }
    else {
      local_4c = unreachable;
      bVar1 = wasm::Type::operator==(&ifFalse->type,&local_4c);
      if (bVar1) {
        Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>::pushTask
                  ((Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_> *)
                   (currp_local + 0xb),doStartUnreachableBlock,(Expression **)curr);
      }
    }
    break;
  case CallId:
  case CallIndirectId:
  case CallRefId:
    bVar1 = isReturnCall(ifFalse);
    if (bVar1) {
      Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>::pushTask
                ((Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_> *)
                 (currp_local + 0xb),doEndReturn,(Expression **)curr);
    }
    else {
      catchBodies = (ExpressionList *)
                    Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>::
                    getModule((Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
                               *)(currp_local + 0xb));
      if (((Module *)catchBodies == (Module *)0x0) ||
         (bVar1 = FeatureSet::hasExceptionHandling(&((Module *)catchBodies)->features), bVar1)) {
        Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>::pushTask
                  ((Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_> *)
                   (currp_local + 0xb),doEndCall,(Expression **)curr);
      }
    }
    break;
  case ReturnId:
    Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>::pushTask
              ((Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_> *)
               &(self->
                super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
                ).
                super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
               ,doEndReturn,currp);
    break;
  case TryId:
    Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>::pushTask
              ((Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_> *)
               &(self->
                super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
                ).
                super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
               ,doEndTry,currp);
    pTVar4 = Expression::cast<wasm::Try>(ifFalse);
    pAStack_38 = &(pTVar4->catchBodies).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>;
    for (module_1._4_4_ = 0; uVar5 = (ulong)module_1._4_4_,
        sVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                          (pAStack_38), uVar5 < sVar6; module_1._4_4_ = module_1._4_4_ + 1) {
      Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>::pushTask
                ((Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_> *)
                 (currp_local + 0xb),doEndCatch,(Expression **)curr);
      pWVar3 = (Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_> *)
               (currp_local + 0xb);
      currp_00 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (pAStack_38,(ulong)module_1._4_4_);
      Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>::pushTask
                (pWVar3,scan,currp_00);
      Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>::pushTask
                ((Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_> *)
                 (currp_local + 0xb),doStartCatch,(Expression **)curr);
    }
    Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>::pushTask
              ((Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_> *)
               (currp_local + 0xb),doStartCatches,(Expression **)curr);
    pWVar3 = (Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_> *)
             (currp_local + 0xb);
    pTVar4 = Expression::cast<wasm::Try>(ifFalse);
    Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>::pushTask
              (pWVar3,scan,&pTVar4->body);
    Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>::pushTask
              ((Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_> *)
               (currp_local + 0xb),doStartTry,(Expression **)curr);
    return;
  case TryTableId:
    Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>::pushTask
              ((Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_> *)
               &(self->
                super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
                ).
                super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
               ,doEndTryTable,currp);
    break;
  case ThrowId:
  case RethrowId:
  case ThrowRefId:
    Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>::pushTask
              ((Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_> *)
               &(self->
                super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
                ).
                super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
               ,doEndThrow,currp);
    break;
  case SuspendId:
  case StackSwitchId:
    local_48 = Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>::getModule
                         ((Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_> *)
                          &(self->
                           super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
                           ).
                           super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
                         );
    if ((local_48 == (Module *)0x0) ||
       (bVar1 = FeatureSet::hasExceptionHandling(&local_48->features), bVar1)) {
      Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>::pushTask
                ((Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_> *)
                 (currp_local + 0xb),doEndCall,(Expression **)curr);
    }
    break;
  case ResumeId:
  case ResumeThrowId:
    Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>::pushTask
              ((Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_> *)
               &(self->
                super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
                ).
                super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
               ,doEndResume,currp);
  }
  PostWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>::scan
            ((SpillPointers *)currp_local,(Expression **)curr);
  if (ifFalse->_id == LoopId) {
    Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>::pushTask
              ((Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_> *)
               (currp_local + 0xb),doStartLoop,(Expression **)curr);
  }
  else if (ifFalse->_id == TryTableId) {
    Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>::pushTask
              ((Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_> *)
               (currp_local + 0xb),doStartTryTable,(Expression **)curr);
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

    switch (curr->_id) {
      case Expression::Id::BlockId: {
        self->pushTask(SubType::doEndBlock, currp);
        break;
      }
      case Expression::Id::IfId: {
        self->pushTask(SubType::doEndIf, currp);
        auto* ifFalse = curr->cast<If>()->ifFalse;
        if (ifFalse) {
          self->pushTask(SubType::scan, &curr->cast<If>()->ifFalse);
          self->pushTask(SubType::doStartIfFalse, currp);
        }
        self->pushTask(SubType::scan, &curr->cast<If>()->ifTrue);
        self->pushTask(SubType::doStartIfTrue, currp);
        self->pushTask(SubType::scan, &curr->cast<If>()->condition);
        return; // don't do anything else
      }
      case Expression::Id::LoopId: {
        self->pushTask(SubType::doEndLoop, currp);
        break;
      }
      case Expression::Id::CallId:
      case Expression::Id::CallIndirectId:
      case Expression::Id::CallRefId: {
        if (isReturnCall(curr)) {
          self->pushTask(SubType::doEndReturn, currp);
        } else {
          auto* module = self->getModule();
          if (!module || module->features.hasExceptionHandling()) {
            // This call might throw, so run the code to handle that.
            self->pushTask(SubType::doEndCall, currp);
          }
        }
        break;
      }
      case Expression::Id::ReturnId:
        self->pushTask(SubType::doEndReturn, currp);
        break;
      case Expression::Id::TryId: {
        self->pushTask(SubType::doEndTry, currp);
        auto& catchBodies = curr->cast<Try>()->catchBodies;
        for (Index i = 0; i < catchBodies.size(); i++) {
          self->pushTask(doEndCatch, currp);
          self->pushTask(SubType::scan, &catchBodies[i]);
          self->pushTask(doStartCatch, currp);
        }
        self->pushTask(SubType::doStartCatches, currp);
        self->pushTask(SubType::scan, &curr->cast<Try>()->body);
        self->pushTask(SubType::doStartTry, currp);
        return; // don't do anything else
      }
      case Expression::Id::TryTableId: {
        self->pushTask(SubType::doEndTryTable, currp);
        break;
      }
      case Expression::Id::ThrowId:
      case Expression::Id::RethrowId:
      case Expression::Id::ThrowRefId: {
        self->pushTask(SubType::doEndThrow, currp);
        break;
      }
      case Expression::Id::ResumeId:
      case Expression::Id::ResumeThrowId: {
        self->pushTask(SubType::doEndResume, currp);
        break;
      }
      case Expression::Id::SuspendId:
      case Expression::Id::StackSwitchId: {
        auto* module = self->getModule();
        if (!module || module->features.hasExceptionHandling()) {
          // This might throw, so run the code to handle that.
          self->pushTask(SubType::doEndCall, currp);
        }
        break;
      }
      default: {
        if (Properties::isBranch(curr)) {
          self->pushTask(SubType::doEndBranch, currp);
        } else if (curr->type == Type::unreachable) {
          self->pushTask(SubType::doStartUnreachableBlock, currp);
        }
      }
    }

    PostWalker<SubType, VisitorType>::scan(self, currp);

    switch (curr->_id) {
      case Expression::Id::LoopId: {
        self->pushTask(SubType::doStartLoop, currp);
        break;
      }
      case Expression::Id::TryTableId: {
        self->pushTask(SubType::doStartTryTable, currp);
        break;
      }
      default: {}
    }
  }